

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbyte.hpp
# Opt level: O2

uint64_t poplar::vbyte::decode(uint8_t *codes,uint64_t *val)

{
  byte bVar1;
  ulong uVar2;
  uint64_t uVar3;
  ulong uVar4;
  ulong uVar5;
  
  *val = 0;
  uVar3 = 1;
  uVar4 = 0;
  uVar5 = 0;
  while( true ) {
    bVar1 = codes[uVar3 - 1];
    if (-1 < (char)bVar1) break;
    uVar3 = uVar3 + 1;
    uVar2 = uVar5 & 0x3f;
    uVar5 = uVar5 + 7;
    uVar4 = uVar4 | (ulong)(bVar1 & 0x7f) << uVar2;
    *val = uVar4;
  }
  *val = uVar4 | (ulong)bVar1 << (uVar5 & 0x3f);
  return uVar3;
}

Assistant:

inline uint64_t decode(const uint8_t* codes, uint64_t& val) {
    val = 0;
    uint64_t i = 0, shift = 0;
    while ((codes[i] & 0x80) != 0) {
        val |= (codes[i++] & 127ULL) << shift;
        shift += 7;
    }
    val |= (codes[i++] & 127ULL) << shift;
    return i;
}